

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-dll2.h
# Opt level: O2

void lws_dll2_remove(lws_dll2 *d)

{
  lws_dll2_owner *plVar1;
  lws_dll2 *plVar2;
  lws_dll2 *plVar3;
  
  plVar1 = d->owner;
  if (plVar1 != (lws_dll2_owner *)0x0) {
    plVar2 = d->prev;
    plVar3 = d->next;
    if (plVar3 != (lws_dll2 *)0x0) {
      plVar3->prev = plVar2;
    }
    if (plVar2 != (lws_dll2 *)0x0) {
      plVar2->next = plVar3;
    }
    if (plVar1->tail == d) {
      plVar1->tail = plVar2;
    }
    if (plVar1->head == d) {
      plVar1->head = d->next;
    }
    plVar1->count = plVar1->count - 1;
    d->prev = (lws_dll2 *)0x0;
    d->next = (lws_dll2 *)0x0;
    d->owner = (lws_dll2_owner *)0x0;
  }
  return;
}

Assistant:

static LWS_INLINE int
lws_dll2_is_detached(const struct lws_dll2 *d) { return !d->owner; }